

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedBitDecoder.cpp
# Opt level: O2

string * __thiscall
ZXing::OneD::DataBar::DecodeExpandedBits_abi_cxx11_
          (string *__return_storage_ptr__,DataBar *this,BitArray *_bits)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  BitArrayView *pBVar4;
  char y;
  int len;
  undefined8 in_RCX;
  char *aiPrefix;
  BitArrayView *bits_00;
  BitArrayView *bits_01;
  BitArrayView *bits_02;
  BitArrayView *bits_03;
  char *bits_04;
  string *buffer;
  char *in_R8;
  BitArrayView *pBStack_a0;
  BitArrayView bits;
  string header;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bits.cur._M_current = *(uchar **)this;
  bits.bits = (BitArray *)this;
  BitArrayView::readBits(&bits,1);
  iVar1 = BitArrayView::peakBits(&bits,1);
  if (iVar1 == 1) {
    pBVar4 = BitArrayView::skipBits(&bits,1);
    BitArrayView::skipBits(pBVar4,2);
    iVar1 = BitArrayView::readBits(pBVar4,4);
    std::__cxx11::to_string(&local_60,iVar1);
    std::operator+(&local_40,"01",&local_60);
    DecodeCompressedGTIN(&header,&local_40,pBVar4);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    DecodeGeneralPurposeBits_abi_cxx11_(&local_60,(DataBar *)pBVar4,bits_00);
    std::operator+(__return_storage_ptr__,&header,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
LAB_00171748:
    std::__cxx11::string::~string((string *)&header);
    return __return_storage_ptr__;
  }
  iVar1 = BitArrayView::peakBits(&bits,2);
  if (iVar1 == 0) {
    pBVar4 = BitArrayView::skipBits(&bits,2);
    BitArrayView::skipBits(pBVar4,2);
    DecodeGeneralPurposeBits_abi_cxx11_(__return_storage_ptr__,(DataBar *)pBVar4,bits_02);
    return __return_storage_ptr__;
  }
  iVar1 = BitArrayView::peakBits(&bits,4);
  len = (int)in_RCX;
  if (iVar1 == 5) {
    pBVar4 = BitArrayView::skipBits(&bits,4);
    DecodeAI01GTIN_abi_cxx11_(__return_storage_ptr__,(DataBar *)pBVar4,bits_03);
    uVar3 = BitArrayView::readBits(pBVar4,0xf);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = uVar3 - 10000;
    if ((int)uVar3 < 10000) {
      uVar2 = uVar3;
    }
    ToString<int,void>(&header,(ZXing *)(ulong)uVar2,6,len);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_00171748;
  }
  if (iVar1 == 4) {
    pBVar4 = BitArrayView::skipBits(&bits,4);
    DecodeAI01GTIN_abi_cxx11_(__return_storage_ptr__,(DataBar *)pBVar4,bits_01);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = BitArrayView::readBits(pBVar4,0xf);
    ToString<int,void>(&header,(ZXing *)(ulong)uVar2,6,len);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_00171748;
  }
  iVar1 = BitArrayView::peakBits(&bits,5);
  y = (char)in_RCX;
  if (iVar1 == 0xd) {
    pBVar4 = BitArrayView::skipBits(&bits,5);
    pBStack_a0 = (BitArrayView *)0x33;
LAB_001718a0:
    DecodeAI0139yx_abi_cxx11_(__return_storage_ptr__,(DataBar *)pBVar4,pBStack_a0,y);
    return __return_storage_ptr__;
  }
  if (iVar1 == 0xc) {
    pBVar4 = BitArrayView::skipBits(&bits,5);
    pBStack_a0 = (BitArrayView *)0x32;
    goto LAB_001718a0;
  }
  iVar1 = BitArrayView::readBits(&bits,7);
  switch(iVar1) {
  case 0x38:
    bits_04 = "310";
    break;
  case 0x39:
    bits_04 = "320";
    break;
  case 0x3a:
    bits_04 = "310";
    goto LAB_001718f7;
  case 0x3b:
    bits_04 = "320";
LAB_001718f7:
    aiPrefix = "13";
    goto LAB_00171937;
  case 0x3c:
    bits_04 = "310";
    goto LAB_00171920;
  case 0x3d:
    bits_04 = "320";
LAB_00171920:
    aiPrefix = "15";
    goto LAB_00171937;
  case 0x3e:
    bits_04 = "310";
    goto LAB_00171930;
  case 0x3f:
    bits_04 = "320";
LAB_00171930:
    aiPrefix = "17";
    goto LAB_00171937;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  aiPrefix = "11";
LAB_00171937:
  DecodeAI013x0x1x_abi_cxx11_
            (__return_storage_ptr__,(DataBar *)&bits,(BitArrayView *)bits_04,aiPrefix,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string DecodeExpandedBits(const BitArray& _bits)
{
	auto bits = BitArrayView(_bits);
	bits.readBits(1); // skip linkage bit

	if (bits.peakBits(1) == 1)
		return DecodeAI01AndOtherAIs(bits.skipBits(1));

	if (bits.peakBits(2) == 0)
		return DecodeAnyAI(bits.skipBits(2));

	switch (bits.peakBits(4)) {
	case 4: return DecodeAI013103(bits.skipBits(4));
	case 5: return DecodeAI01320x(bits.skipBits(4));
	}

	switch (bits.peakBits(5)) {
	case 12: return DecodeAI0139yx(bits.skipBits(5), '2');
	case 13: return DecodeAI0139yx(bits.skipBits(5), '3');
	}

	switch (bits.readBits(7)) {
	case 56: return DecodeAI013x0x1x(bits, "310", "11");
	case 57: return DecodeAI013x0x1x(bits, "320", "11");
	case 58: return DecodeAI013x0x1x(bits, "310", "13");
	case 59: return DecodeAI013x0x1x(bits, "320", "13");
	case 60: return DecodeAI013x0x1x(bits, "310", "15");
	case 61: return DecodeAI013x0x1x(bits, "320", "15");
	case 62: return DecodeAI013x0x1x(bits, "310", "17");
	case 63: return DecodeAI013x0x1x(bits, "320", "17");
	}

	return {};
}